

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermediate.h
# Opt level: O0

void __thiscall
glslang::TIntermOperator::crackTexture
          (TIntermOperator *this,TSampler sampler,TCrackedTextureOp *cracked)

{
  bool bVar1;
  TCrackedTextureOp *cracked_local;
  TIntermOperator *this_local;
  TSampler sampler_local;
  
  cracked->query = false;
  cracked->proj = false;
  cracked->lod = false;
  cracked->fetch = false;
  cracked->offset = false;
  cracked->offsets = false;
  cracked->gather = false;
  cracked->grad = false;
  cracked->subpass = false;
  cracked->attachmentEXT = false;
  cracked->lodClamp = false;
  cracked->fragMask = false;
  this_local._4_4_ = sampler;
  switch(this->op) {
  case EOpImageQuerySize:
  case EOpImageQuerySamples:
  case EOpTextureQuerySize:
  case EOpTextureQueryLod:
  case EOpTextureQueryLevels:
  case EOpTextureQuerySamples:
  case EOpSparseTexelsResident:
    cracked->query = true;
    break;
  default:
    break;
  case EOpImageLoadLod:
  case EOpImageStoreLod:
  case EOpSparseImageLoadLod:
    cracked->lod = true;
    break;
  case EOpSubpassLoad:
  case EOpSubpassLoadMS:
    cracked->subpass = true;
    break;
  case EOpColorAttachmentReadEXT:
    cracked->attachmentEXT = true;
    break;
  case EOpTexture:
  case EOpSparseTexture:
    break;
  case EOpTextureProj:
    cracked->proj = true;
    break;
  case EOpTextureLod:
  case EOpSparseTextureLod:
    cracked->lod = true;
    break;
  case EOpTextureOffset:
  case EOpSparseTextureOffset:
    cracked->offset = true;
    break;
  case EOpTextureFetch:
  case EOpSparseTextureFetch:
    cracked->fetch = true;
    bVar1 = TSampler::is1D((TSampler *)((long)&this_local + 4));
    if (((bVar1) ||
        ((((uint)this_local._4_4_ >> 8 & 0xff) == 2 &&
         (bVar1 = TSampler::isMultiSample((TSampler *)((long)&this_local + 4)), !bVar1)))) ||
       (((uint)this_local._4_4_ >> 8 & 0xff) == 3)) {
      cracked->lod = true;
    }
    break;
  case EOpTextureFetchOffset:
  case EOpSparseTextureFetchOffset:
    cracked->fetch = true;
    cracked->offset = true;
    bVar1 = TSampler::is1D((TSampler *)((long)&this_local + 4));
    if ((bVar1) ||
       (((((uint)this_local._4_4_ >> 8 & 0xff) == 2 &&
         (bVar1 = TSampler::isMultiSample((TSampler *)((long)&this_local + 4)), !bVar1)) ||
        (((uint)this_local._4_4_ >> 8 & 0xff) == 3)))) {
      cracked->lod = true;
    }
    break;
  case EOpTextureProjOffset:
    cracked->offset = true;
    cracked->proj = true;
    break;
  case EOpTextureLodOffset:
  case EOpSparseTextureLodOffset:
    cracked->offset = true;
    cracked->lod = true;
    break;
  case EOpTextureProjLod:
    cracked->lod = true;
    cracked->proj = true;
    break;
  case EOpTextureProjLodOffset:
    cracked->offset = true;
    cracked->lod = true;
    cracked->proj = true;
    break;
  case EOpTextureGrad:
  case EOpSparseTextureGrad:
    cracked->grad = true;
    break;
  case EOpTextureGradOffset:
  case EOpSparseTextureGradOffset:
    cracked->grad = true;
    cracked->offset = true;
    break;
  case EOpTextureProjGrad:
    cracked->grad = true;
    cracked->proj = true;
    break;
  case EOpTextureProjGradOffset:
    cracked->grad = true;
    cracked->offset = true;
    cracked->proj = true;
    break;
  case EOpTextureGather:
  case EOpSparseTextureGather:
    cracked->gather = true;
    break;
  case EOpTextureGatherOffset:
  case EOpSparseTextureGatherOffset:
    cracked->gather = true;
    cracked->offset = true;
    break;
  case EOpTextureGatherOffsets:
  case EOpSparseTextureGatherOffsets:
    cracked->gather = true;
    cracked->offsets = true;
    break;
  case EOpTextureClamp:
  case EOpSparseTextureClamp:
    cracked->lodClamp = true;
    break;
  case EOpTextureOffsetClamp:
  case EOpSparseTextureOffsetClamp:
    cracked->offset = true;
    cracked->lodClamp = true;
    break;
  case EOpTextureGradClamp:
  case EOpSparseTextureGradClamp:
    cracked->grad = true;
    cracked->lodClamp = true;
    break;
  case EOpTextureGradOffsetClamp:
  case EOpSparseTextureGradOffsetClamp:
    cracked->grad = true;
    cracked->offset = true;
    cracked->lodClamp = true;
    break;
  case EOpTextureGatherLod:
  case EOpSparseTextureGatherLod:
    cracked->gather = true;
    cracked->lod = true;
    break;
  case EOpTextureGatherLodOffset:
  case EOpSparseTextureGatherLodOffset:
    cracked->gather = true;
    cracked->offset = true;
    cracked->lod = true;
    break;
  case EOpTextureGatherLodOffsets:
  case EOpSparseTextureGatherLodOffsets:
    cracked->gather = true;
    cracked->offsets = true;
    cracked->lod = true;
    break;
  case EOpFragmentMaskFetch:
    cracked->subpass = ((uint)sampler >> 8 & 0xff) == 7;
    cracked->fragMask = true;
    break;
  case EOpFragmentFetch:
    cracked->subpass = ((uint)sampler >> 8 & 0xff) == 7;
    cracked->fragMask = true;
    break;
  case EOpImageSampleFootprintNV:
    break;
  case EOpImageSampleFootprintClampNV:
    cracked->lodClamp = true;
    break;
  case EOpImageSampleFootprintLodNV:
    cracked->lod = true;
    break;
  case EOpImageSampleFootprintGradNV:
    cracked->grad = true;
    break;
  case EOpImageSampleFootprintGradClampNV:
    cracked->lodClamp = true;
    cracked->grad = true;
  }
  return;
}

Assistant:

void crackTexture(TSampler sampler, TCrackedTextureOp& cracked) const
    {
        cracked.query = false;
        cracked.proj = false;
        cracked.lod = false;
        cracked.fetch = false;
        cracked.offset = false;
        cracked.offsets = false;
        cracked.gather = false;
        cracked.grad = false;
        cracked.subpass = false;
        cracked.attachmentEXT = false;
        cracked.lodClamp = false;
        cracked.fragMask = false;

        switch (op) {
        case EOpImageQuerySize:
        case EOpImageQuerySamples:
        case EOpTextureQuerySize:
        case EOpTextureQueryLod:
        case EOpTextureQueryLevels:
        case EOpTextureQuerySamples:
        case EOpSparseTexelsResident:
            cracked.query = true;
            break;
        case EOpTexture:
        case EOpSparseTexture:
            break;
        case EOpTextureProj:
            cracked.proj = true;
            break;
        case EOpTextureLod:
        case EOpSparseTextureLod:
            cracked.lod = true;
            break;
        case EOpTextureOffset:
        case EOpSparseTextureOffset:
            cracked.offset = true;
            break;
        case EOpTextureFetch:
        case EOpSparseTextureFetch:
            cracked.fetch = true;
            if (sampler.is1D() || (sampler.dim == Esd2D && ! sampler.isMultiSample()) || sampler.dim == Esd3D)
                cracked.lod = true;
            break;
        case EOpTextureFetchOffset:
        case EOpSparseTextureFetchOffset:
            cracked.fetch = true;
            cracked.offset = true;
            if (sampler.is1D() || (sampler.dim == Esd2D && ! sampler.isMultiSample()) || sampler.dim == Esd3D)
                cracked.lod = true;
            break;
        case EOpTextureProjOffset:
            cracked.offset = true;
            cracked.proj = true;
            break;
        case EOpTextureLodOffset:
        case EOpSparseTextureLodOffset:
            cracked.offset = true;
            cracked.lod = true;
            break;
        case EOpTextureProjLod:
            cracked.lod = true;
            cracked.proj = true;
            break;
        case EOpTextureProjLodOffset:
            cracked.offset = true;
            cracked.lod = true;
            cracked.proj = true;
            break;
        case EOpTextureGrad:
        case EOpSparseTextureGrad:
            cracked.grad = true;
            break;
        case EOpTextureGradOffset:
        case EOpSparseTextureGradOffset:
            cracked.grad = true;
            cracked.offset = true;
            break;
        case EOpTextureProjGrad:
            cracked.grad = true;
            cracked.proj = true;
            break;
        case EOpTextureProjGradOffset:
            cracked.grad = true;
            cracked.offset = true;
            cracked.proj = true;
            break;
        case EOpTextureClamp:
        case EOpSparseTextureClamp:
            cracked.lodClamp = true;
            break;
        case EOpTextureOffsetClamp:
        case EOpSparseTextureOffsetClamp:
            cracked.offset = true;
            cracked.lodClamp = true;
            break;
        case EOpTextureGradClamp:
        case EOpSparseTextureGradClamp:
            cracked.grad = true;
            cracked.lodClamp = true;
            break;
        case EOpTextureGradOffsetClamp:
        case EOpSparseTextureGradOffsetClamp:
            cracked.grad = true;
            cracked.offset = true;
            cracked.lodClamp = true;
            break;
        case EOpTextureGather:
        case EOpSparseTextureGather:
            cracked.gather = true;
            break;
        case EOpTextureGatherOffset:
        case EOpSparseTextureGatherOffset:
            cracked.gather = true;
            cracked.offset = true;
            break;
        case EOpTextureGatherOffsets:
        case EOpSparseTextureGatherOffsets:
            cracked.gather = true;
            cracked.offsets = true;
            break;
        case EOpTextureGatherLod:
        case EOpSparseTextureGatherLod:
            cracked.gather = true;
            cracked.lod    = true;
            break;
        case EOpTextureGatherLodOffset:
        case EOpSparseTextureGatherLodOffset:
            cracked.gather = true;
            cracked.offset = true;
            cracked.lod    = true;
            break;
        case EOpTextureGatherLodOffsets:
        case EOpSparseTextureGatherLodOffsets:
            cracked.gather  = true;
            cracked.offsets = true;
            cracked.lod     = true;
            break;
        case EOpImageLoadLod:
        case EOpImageStoreLod:
        case EOpSparseImageLoadLod:
            cracked.lod = true;
            break;
        case EOpFragmentMaskFetch:
            cracked.subpass = sampler.dim == EsdSubpass;
            cracked.fragMask = true;
            break;
        case EOpFragmentFetch:
            cracked.subpass = sampler.dim == EsdSubpass;
            cracked.fragMask = true;
            break;
        case EOpImageSampleFootprintNV:
            break;
        case EOpImageSampleFootprintClampNV:
            cracked.lodClamp = true;
            break;
        case EOpImageSampleFootprintLodNV:
            cracked.lod = true;
            break;
        case EOpImageSampleFootprintGradNV:
            cracked.grad = true;
            break;
        case EOpImageSampleFootprintGradClampNV:
            cracked.lodClamp = true;
            cracked.grad = true;
            break;
        case EOpSubpassLoad:
        case EOpSubpassLoadMS:
            cracked.subpass = true;
            break;
        case EOpColorAttachmentReadEXT:
            cracked.attachmentEXT = true;
            break;
        default:
            break;
        }
    }